

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

size_t lua_rawlen(lua_State *L,int idx)

{
  TValue *pTVar1;
  size_t sVar2;
  lua_Unsigned lVar3;
  uint uVar4;
  
  pTVar1 = index2addr(L,idx);
  uVar4 = pTVar1->tt_ & 0x3f;
  if (uVar4 == 0x14) {
    sVar2 = *(size_t *)((pTVar1->value_).f + 0x10);
  }
  else {
    if (uVar4 == 5) {
      lVar3 = luaH_getn((Table *)(pTVar1->value_).gc);
      return lVar3;
    }
    if (uVar4 == 7) {
      sVar2 = *(size_t *)((pTVar1->value_).f + 0x18);
    }
    else if (uVar4 == 4) {
      sVar2 = (size_t)(byte)(pTVar1->value_).f[0xb];
    }
    else {
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

LUA_API size_t lua_rawlen (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TSHRSTR: return tsvalue(o)->shrlen;
    case LUA_TLNGSTR: return tsvalue(o)->u.lnglen;
    case LUA_TUSERDATA: return uvalue(o)->len;
    case LUA_TTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}